

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgStatement.cpp
# Opt level: O0

void __thiscall
rsg::DeclarationStatement::tokenize
          (DeclarationStatement *this,GeneratorState *state,TokenStream *str)

{
  TokenStream *pTVar1;
  Token local_60;
  Token local_50 [2];
  Token local_30;
  TokenStream *local_20;
  TokenStream *str_local;
  GeneratorState *state_local;
  DeclarationStatement *this_local;
  
  local_20 = str;
  str_local = (TokenStream *)state;
  state_local = (GeneratorState *)this;
  rsg::Variable::tokenizeDeclaration(this->m_variable,state,str);
  pTVar1 = local_20;
  if (this->m_expression != (Expression *)0x0) {
    Token::Token(&local_30,EQUAL);
    TokenStream::operator<<(pTVar1,&local_30);
    Token::~Token(&local_30);
    (*this->m_expression->_vptr_Expression[3])(this->m_expression,str_local,local_20);
  }
  pTVar1 = local_20;
  Token::Token(local_50,SEMICOLON);
  pTVar1 = TokenStream::operator<<(pTVar1,local_50);
  Token::Token(&local_60,NEWLINE);
  TokenStream::operator<<(pTVar1,&local_60);
  Token::~Token(&local_60);
  Token::~Token(local_50);
  return;
}

Assistant:

void DeclarationStatement::tokenize (GeneratorState& state, TokenStream& str) const
{
	m_variable->tokenizeDeclaration(state, str);

	if (m_expression)
	{
		str << Token::EQUAL;
		m_expression->tokenize(state, str);
	}

	str << Token::SEMICOLON << Token::NEWLINE;
}